

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessStartJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  pointer pbVar1;
  element_type *peVar2;
  type tVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  char *pcVar5;
  long lVar6;
  char *begin;
  _Alloc_hider _Var7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint16_t port;
  Error error;
  string existingCommissionerId;
  ushort local_122;
  type local_120;
  uint *local_118;
  long local_110;
  uint local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  parse_func local_d0 [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_78;
  type local_58;
  uint *local_50;
  long local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_120 = 0;
  local_118 = &local_108;
  local_110 = 0;
  local_108 = local_108 & 0xffffff00;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pbVar1 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_f8._0_4_ = none_type;
    local_f0._M_p = "too few arguments";
    local_e8 = 0x11;
    local_e0._M_allocated_capacity = 0;
    local_d0[0] = (parse_func)0x0;
    begin = "too few arguments";
    local_e0._8_8_ = (format_string_checker<char> *)local_f8;
    do {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_f8);
      }
      begin = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_a0._0_4_ = uint_type;
    local_98 = local_90._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    local_120 = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_98);
    if (local_98 != local_90._M_local_buf + 8) {
      operator_delete(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_002432ae:
      operator_delete(local_78._M_dataplus._M_p);
    }
LAB_002432b3:
    tVar3 = local_120;
    if (local_c0._M_string_length == 0) goto LAB_00243344;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "there is an existing active commissioner: ",&local_c0);
    local_f8._0_4_ = tVar3;
    local_f0._M_p = (pointer)&local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,CONCAT44(local_a0._4_4_,local_a0._0_4_),
               local_98 + CONCAT44(local_a0._4_4_,local_a0._0_4_));
    local_120 = local_f8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p);
    }
    _Var7._M_p = (pointer)CONCAT44(local_a0._4_4_,local_a0._0_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p == &local_90) goto LAB_00243344;
  }
  else {
    utils::ParseInteger<unsigned_short>((Error *)local_f8,&local_122,pbVar1 + 2);
    local_120 = local_f8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f0);
    tVar3 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p);
    }
    if (tVar3 != none_type) goto LAB_002432b3;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                      ((this->mContext).mCommandKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->mContext).mCommandKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"--connect-only");
    if (_Var4._M_current ==
        (this->mContext).mCommandKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      peVar2 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0xc])
                (local_f8,peVar2,&local_c0,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)local_122);
      local_120 = local_f8._0_4_;
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f0);
      local_78._M_dataplus._M_p = local_f0._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) goto LAB_002432ae;
      goto LAB_002432b3;
    }
    peVar2 = (aCommissioner->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[10])
              (local_f8,peVar2,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)local_122);
    local_120 = local_f8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f0);
    _Var7._M_p = local_f0._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p == &local_e0) goto LAB_00243344;
  }
  operator_delete(_Var7._M_p);
LAB_00243344:
  lVar6 = local_110;
  local_58 = local_120;
  if (local_118 == &local_108) {
    uStack_38 = uStack_100;
    uStack_34 = uStack_fc;
    local_118 = &local_40;
  }
  _local_40 = CONCAT44(uStack_104,local_108);
  local_48 = local_110;
  local_110 = 0;
  local_108 = local_108 & 0xffffff00;
  (__return_storage_ptr__->mError).mCode = local_120;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  lVar6 = lVar6 + (long)local_118;
  local_50 = local_118;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->mError).mMessage,local_50,lVar6);
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStartJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Error       error;
    uint16_t    port;
    std::string existingCommissionerId;
    bool        connectOnly = false;

    VerifyOrExit(aExpr.size() >= 3, error = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(error = ParseInteger(port, aExpr[2]));

    {
        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--connect-only");

        if (it != mContext.mCommandKeys.end())
        {
            connectOnly = true;
            error       = aCommissioner->Connect(aExpr[1], port);
        }
        else
        {
            error = aCommissioner->Start(existingCommissionerId, aExpr[1], port);
        }
    }

exit:
    if (!connectOnly && !existingCommissionerId.empty())
    {
        error = Error{error.GetCode(), "there is an existing active commissioner: " + existingCommissionerId};
    }
    return error;
}